

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timMan.c
# Opt level: O0

void Tim_ManPrintStats(Tim_Man_t *p,int nAnd2Delay)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  void *pvVar7;
  Vec_Int_t *p_00;
  Vec_Ptr_t *p_01;
  int local_3c;
  int IdMax;
  int Count;
  int i;
  Vec_Ptr_t *vBoxes;
  Vec_Int_t *vCounts;
  Tim_Box_t *pBox;
  int nAnd2Delay_local;
  Tim_Man_t *p_local;
  
  if (p != (Tim_Man_t *)0x0) {
    Abc_Print(1,"Hierarchy      :  ");
    uVar1 = Tim_ManPiNum(p);
    uVar2 = Tim_ManCiNum(p);
    uVar3 = Tim_ManPoNum(p);
    uVar4 = Tim_ManCoNum(p);
    uVar5 = Tim_ManBoxNum(p);
    printf("PI/CI = %d/%d   PO/CO = %d/%d   Box = %d   ",(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,
           (ulong)uVar4,(ulong)uVar5);
    if (nAnd2Delay != 0) {
      printf("delay(AND2) = %d",(ulong)(uint)nAnd2Delay);
    }
    printf("\n");
    iVar6 = Tim_ManBoxNum(p);
    if (iVar6 != 0) {
      local_3c = 0;
      for (IdMax = 0; iVar6 = Vec_PtrSize(p->vBoxes), IdMax < iVar6; IdMax = IdMax + 1) {
        pvVar7 = Vec_PtrEntry(p->vBoxes,IdMax);
        local_3c = Abc_MaxInt(local_3c,*(int *)((long)pvVar7 + 0x10));
      }
      p_00 = Vec_IntStart(local_3c + 1);
      p_01 = Vec_PtrStart(local_3c + 1);
      for (IdMax = 0; iVar6 = Vec_PtrSize(p->vBoxes), IdMax < iVar6; IdMax = IdMax + 1) {
        pvVar7 = Vec_PtrEntry(p->vBoxes,IdMax);
        Vec_IntAddToEntry(p_00,*(int *)((long)pvVar7 + 0x10),1);
        Vec_PtrWriteEntry(p_01,*(int *)((long)pvVar7 + 0x10),pvVar7);
      }
      for (IdMax = 0; iVar6 = Vec_IntSize(p_00), IdMax < iVar6; IdMax = IdMax + 1) {
        uVar1 = Vec_IntEntry(p_00,IdMax);
        if (uVar1 != 0) {
          pvVar7 = Vec_PtrEntry(p_01,IdMax);
          printf("    Box %4d      ",(ulong)(uint)IdMax);
          printf("Num = %4d   ",(ulong)uVar1);
          printf("Ins = %4d   ",(ulong)*(uint *)((long)pvVar7 + 8));
          printf("Outs = %4d",(ulong)*(uint *)((long)pvVar7 + 0xc));
          printf("\n");
        }
      }
      Vec_IntFree(p_00);
      Vec_PtrFree(p_01);
    }
  }
  return;
}

Assistant:

void Tim_ManPrintStats( Tim_Man_t * p, int nAnd2Delay )
{
    Tim_Box_t * pBox;
    Vec_Int_t * vCounts;
    Vec_Ptr_t * vBoxes;
    int i, Count, IdMax;
    if ( p == NULL )
        return;
    Abc_Print( 1, "Hierarchy      :  " );
    printf( "PI/CI = %d/%d   PO/CO = %d/%d   Box = %d   ", 
        Tim_ManPiNum(p), Tim_ManCiNum(p), 
        Tim_ManPoNum(p), Tim_ManCoNum(p), 
        Tim_ManBoxNum(p) );
    if ( nAnd2Delay )
        printf( "delay(AND2) = %d", nAnd2Delay );
    printf( "\n" );
    if ( Tim_ManBoxNum(p) == 0 )
        return;
    IdMax = 0;
    Tim_ManForEachBox( p, pBox, i )
        IdMax = Abc_MaxInt( IdMax, pBox->iDelayTable );
    vCounts = Vec_IntStart( IdMax+1 );
    vBoxes  = Vec_PtrStart( IdMax+1 );
    Tim_ManForEachBox( p, pBox, i )
    {
        Vec_IntAddToEntry( vCounts, pBox->iDelayTable, 1 );
        Vec_PtrWriteEntry( vBoxes, pBox->iDelayTable, pBox );
    }
    // print statistics about boxes
    Vec_IntForEachEntry( vCounts, Count, i )
    {
        if ( Count == 0 ) continue;
        pBox = (Tim_Box_t *)Vec_PtrEntry( vBoxes, i );
        printf( "    Box %4d      ", i );
        printf( "Num = %4d   ", Count );
        printf( "Ins = %4d   ", pBox->nInputs );
        printf( "Outs = %4d",   pBox->nOutputs );
        printf( "\n" );
    }
    Vec_IntFree( vCounts );
    Vec_PtrFree( vBoxes );
}